

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coded_stream.cc
# Opt level: O0

uint8_t * __thiscall google::protobuf::io::EpsCopyOutputStream::Next(EpsCopyOutputStream *this)

{
  undefined8 uVar1;
  int iVar2;
  uint8_t *puVar3;
  LogMessage *pLVar4;
  LogFinisher local_ba;
  byte local_b9;
  LogMessage local_b8;
  EpsCopyOutputStream *local_80;
  void *data;
  EpsCopyOutputStream *pEStack_70;
  int size;
  uint8_t *ptr;
  byte local_51;
  LogMessage local_50;
  EpsCopyOutputStream *local_18;
  EpsCopyOutputStream *this_local;
  
  local_51 = 0;
  local_18 = this;
  if ((this->had_error_ & 1U) != 0) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
               ,0x314);
    local_51 = 1;
    pLVar4 = internal::LogMessage::operator<<(&local_50,"CHECK failed: !had_error_: ");
    internal::LogFinisher::operator=((LogFinisher *)((long)&ptr + 3),pLVar4);
  }
  if ((local_51 & 1) != 0) {
    internal::LogMessage::~LogMessage(&local_50);
  }
  if (this->stream_ == (ZeroCopyOutputStream *)0x0) {
    this_local = (EpsCopyOutputStream *)Error(this);
  }
  else if (this->buffer_end_ == (uint8_t *)0x0) {
    *(undefined8 *)this->buffer_ = *(undefined8 *)this->end_;
    *(undefined8 *)(this->buffer_ + 8) = *(undefined8 *)(this->end_ + 8);
    this->buffer_end_ = this->end_;
    this->end_ = this->buffer_ + 0x10;
    this_local = (EpsCopyOutputStream *)this->buffer_;
  }
  else {
    memcpy(this->buffer_end_,this->buffer_,(long)this->end_ - (long)this->buffer_);
    do {
      iVar2 = (*this->stream_->_vptr_ZeroCopyOutputStream[2])
                        (this->stream_,&local_80,(long)&data + 4);
      if ((((byte)iVar2 ^ 0xff) & 1) != 0) {
        puVar3 = Error(this);
        return puVar3;
      }
      pEStack_70 = local_80;
    } while (data._4_4_ == 0);
    if (data._4_4_ < 0x11) {
      local_b9 = 0;
      if (data._4_4_ < 1) {
        internal::LogMessage::LogMessage
                  (&local_b8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]coremltools/deps/protobuf/src/google/protobuf/io/coded_stream.cc"
                   ,0x32a);
        local_b9 = 1;
        pLVar4 = internal::LogMessage::operator<<(&local_b8,"CHECK failed: size > 0: ");
        internal::LogFinisher::operator=(&local_ba,pLVar4);
      }
      if ((local_b9 & 1) != 0) {
        internal::LogMessage::~LogMessage(&local_b8);
      }
      uVar1 = *(undefined8 *)(this->end_ + 8);
      *(undefined8 *)this->buffer_ = *(undefined8 *)this->end_;
      *(undefined8 *)(this->buffer_ + 8) = uVar1;
      this->buffer_end_ = (uint8_t *)pEStack_70;
      this->end_ = this->buffer_ + data._4_4_;
      this_local = (EpsCopyOutputStream *)this->buffer_;
    }
    else {
      puVar3 = this->end_;
      local_80->end_ = *(uint8_t **)puVar3;
      local_80->buffer_end_ = *(uint8_t **)(puVar3 + 8);
      this->end_ = local_80->buffer_ + (long)data._4_4_ + -0x20;
      this->buffer_end_ = (uint8_t *)0x0;
      this_local = local_80;
    }
  }
  return (uint8_t *)this_local;
}

Assistant:

uint8_t* EpsCopyOutputStream::Next() {
  GOOGLE_DCHECK(!had_error_);  // NOLINT
  if (PROTOBUF_PREDICT_FALSE(stream_ == nullptr)) return Error();
  if (buffer_end_) {
    // We're in the patch buffer and need to fill up the previous buffer.
    std::memcpy(buffer_end_, buffer_, end_ - buffer_);
    uint8_t* ptr;
    int size;
    do {
      void* data;
      if (PROTOBUF_PREDICT_FALSE(!stream_->Next(&data, &size))) {
        // Stream has an error, we use the patch buffer to continue to be
        // able to write.
        return Error();
      }
      ptr = static_cast<uint8_t*>(data);
    } while (size == 0);
    if (PROTOBUF_PREDICT_TRUE(size > kSlopBytes)) {
      std::memcpy(ptr, end_, kSlopBytes);
      end_ = ptr + size - kSlopBytes;
      buffer_end_ = nullptr;
      return ptr;
    } else {
      GOOGLE_DCHECK(size > 0);  // NOLINT
      // Buffer to small
      std::memmove(buffer_, end_, kSlopBytes);
      buffer_end_ = ptr;
      end_ = buffer_ + size;
      return buffer_;
    }
  } else {
    std::memcpy(buffer_, end_, kSlopBytes);
    buffer_end_ = end_;
    end_ = buffer_ + kSlopBytes;
    return buffer_;
  }
}